

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

bool __thiscall SQInstance::Get(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  int *piVar2;
  SQObjectPtr *in_RDX;
  SQTable *in_RSI;
  long in_RDI;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffc8;
  SQObject *obj;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQObjectPtr *this_00;
  SQObjectPtr *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = SQTable::Get(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (bVar1) {
    if (((in_RDX->super_SQObject)._unVal.nInteger & 0x2000000U) == 0) {
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)(*(long *)(in_RDI + 0x38) + 0x58),
                 (in_RDX->super_SQObject)._unVal.nInteger & 0xffffff);
      ::SQObjectPtr::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      piVar2 = (int *)(in_RDI + 0x58 + ((in_RDX->super_SQObject)._unVal.nInteger & 0xffffffU) * 0x10
                      );
      if (*piVar2 == 0x8010000) {
        obj = *(SQObject **)(*(long *)(piVar2 + 2) + 0x18);
        this_00 = *(SQObjectPtr **)(*(long *)(piVar2 + 2) + 0x20);
      }
      else {
        obj = *(SQObject **)piVar2;
        this_00 = *(SQObjectPtr **)(piVar2 + 2);
      }
      ::SQObjectPtr::operator=(this_00,obj);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val)  {
        if(_class->_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _values[_member_idx(val)];
                val = _realval(o);
            }
            else {
                val = _class->_methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }